

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::contextCallbackOverrideInit
          (CLIntercept *this,cl_context_properties *properties,
          _func_void_char_ptr_void_ptr_size_t_void_ptr **pCallback,void **pUserData,
          SContextCallbackInfo **pContextCallbackInfo,
          cl_context_properties **pLocalContextProperties)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong uVar3;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  long *in_R9;
  size_t numProperties;
  bool foundPerformanceHintEnum;
  long local_40;
  bool local_31;
  long *local_30;
  long *local_28;
  long *local_20;
  undefined8 *local_18;
  long local_10;
  
  local_30 = in_R9;
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 0x99d5) & 1) != 0) {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    pvVar2 = operator_new(0x18);
    *local_28 = (long)pvVar2;
    if (*local_28 != 0) {
      *(long *)*local_28 = in_RDI;
      *(undefined8 *)(*local_28 + 8) = *local_18;
      *(long *)(*local_28 + 0x10) = *local_20;
      *local_18 = contextCallbackCaller;
      *local_20 = *local_28;
    }
  }
  if (*(int *)(in_RDI + 0x99d8) != 0) {
    local_31 = false;
    local_40 = 0;
    if (local_10 != 0) {
      for (; *(long *)(local_10 + local_40 * 8) != 0; local_40 = local_40 + 2) {
        if (*(long *)(local_10 + local_40 * 8) == 0x4106) {
          local_31 = true;
        }
      }
    }
    if (local_31 == false) {
      local_40 = local_40 + 2;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_40 + 1;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar2 = operator_new__(uVar3);
    *local_30 = (long)pvVar2;
    if (*local_30 != 0) {
      local_40 = 0;
      if (local_10 != 0) {
        for (; *(long *)(local_10 + local_40 * 8) != 0; local_40 = local_40 + 2) {
          *(undefined8 *)(*local_30 + local_40 * 8) = *(undefined8 *)(local_10 + local_40 * 8);
          if (*(long *)(local_10 + local_40 * 8) == 0x4106) {
            std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_31);
            *(ulong *)(*local_30 + 8 + local_40 * 8) = (ulong)*(uint *)(in_RDI + 0x99d8);
          }
          else {
            *(undefined8 *)(*local_30 + 8 + local_40 * 8) =
                 *(undefined8 *)(local_10 + 8 + local_40 * 8);
          }
        }
      }
      if ((local_31 & 1U) == 0) {
        *(undefined8 *)(*local_30 + local_40 * 8) = 0x4106;
        *(ulong *)(*local_30 + 8 + local_40 * 8) = (ulong)*(uint *)(in_RDI + 0x99d8);
        local_40 = local_40 + 2;
      }
      *(undefined8 *)(*local_30 + local_40 * 8) = 0;
    }
  }
  return;
}

Assistant:

void CLIntercept::contextCallbackOverrideInit(
    const cl_context_properties* properties,
    void (CL_CALLBACK*& pCallback)( const char*, const void*, size_t, void* ),
    void*& pUserData,
    SContextCallbackInfo*& pContextCallbackInfo,
    cl_context_properties*& pLocalContextProperties )
{
    if( m_Config.ContextCallbackLogging )
    {
        pContextCallbackInfo = new SContextCallbackInfo;
        if( pContextCallbackInfo )
        {
            pContextCallbackInfo->pIntercept = this;
            pContextCallbackInfo->pApplicationCallback = pCallback;
            pContextCallbackInfo->pUserData = pUserData;

            pCallback = CLIntercept::contextCallbackCaller;
            pUserData = pContextCallbackInfo;
        }
    }

    if( m_Config.ContextHintLevel )
    {
        // We want to add a context hints to the context properties, unless
        // the context properties already requests performance hints
        // (requesting the same property twice is an error).  So, look through
        // the context properties for the performance hint enum.  We need to
        // do this anyways to count the number of property pairs.
        bool    foundPerformanceHintEnum = false;
        size_t  numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                if( properties[ numProperties ] == CL_CONTEXT_SHOW_DIAGNOSTICS_INTEL )
                {
                    foundPerformanceHintEnum = true;
                }
                numProperties += 2;
            }
        }

        if( foundPerformanceHintEnum == false )
        {
            // The performance hint property isn't already set, so we'll
            // need to allocate an extra pair of properties for it.
            numProperties += 2;
        }

        // Allocate a new array of properties.  We need to allocate two
        // properties for each pair, plus one property for the terminating
        // zero.
        pLocalContextProperties = new cl_context_properties[ numProperties + 1 ];
        if( pLocalContextProperties )
        {
            // Copy the old properties array to the new properties array,
            // if the new properties array exists.
            numProperties = 0;
            if( properties )
            {
                while( properties[ numProperties ] != 0 )
                {
                    pLocalContextProperties[ numProperties ] = properties[ numProperties ];
                    if( properties[ numProperties ] == CL_CONTEXT_SHOW_DIAGNOSTICS_INTEL )
                    {
                        CLI_ASSERT( foundPerformanceHintEnum );
                        pLocalContextProperties[ numProperties + 1 ] = m_Config.ContextHintLevel;
                    }
                    else
                    {
                        pLocalContextProperties[ numProperties + 1 ] = properties[ numProperties + 1 ];
                    }
                    numProperties += 2;
                }
            }
            // Add the performance hint property if it wasn't already set.
            if( foundPerformanceHintEnum == false )
            {
                pLocalContextProperties[ numProperties ] = CL_CONTEXT_SHOW_DIAGNOSTICS_INTEL;
                pLocalContextProperties[ numProperties + 1 ] = m_Config.ContextHintLevel;
                numProperties += 2;
            }
            // Add the terminating zero.
            pLocalContextProperties[ numProperties ] = 0;
        }
    }
}